

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O0

void cmGetCMakeInputs(cmGlobalGenerator *gg,string *sourceDir,string *buildDir,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *internalFiles,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *explicitFiles,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *tmpFiles)

{
  undefined8 uVar1;
  bool bVar2;
  string *__lhs;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *this;
  reference ppcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference pbVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool local_161;
  string local_148;
  string *local_128;
  string *relative;
  string toAdd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  byte local_d2;
  byte local_d1;
  undefined1 local_d0 [6];
  bool isTemporary;
  bool isInternal;
  string startOfFile;
  string *lf;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmMakefile *mf;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *__range1;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *makefiles;
  string cmakeRootDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tmpFiles_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *explicitFiles_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *internalFiles_local;
  string *buildDir_local;
  string *sourceDir_local;
  cmGlobalGenerator *gg_local;
  
  cmakeRootDir.field_2._8_8_ = tmpFiles;
  __lhs = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&makefiles,
                 __lhs,'/');
  this = cmGlobalGenerator::GetMakefiles(gg);
  __end1 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin(this);
  mf = (cmMakefile *)std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::end(this);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                                     *)&mf), bVar2) {
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
              ::operator*(&__end1);
    this_00 = cmMakefile::GetListFiles_abi_cxx11_(*ppcVar3);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    lf = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&lf), bVar2) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      startOfFile.field_2._8_8_ = pbVar4;
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_d0,(ulong)pbVar4);
      local_d1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_d0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&makefiles);
      uVar1 = startOfFile.field_2._8_8_;
      toAdd.field_2._M_local_buf[0xf] = '\0';
      local_161 = false;
      if (!(bool)local_d1) {
        std::operator+(&local_f8,buildDir,'/');
        toAdd.field_2._M_local_buf[0xf] = '\x01';
        lVar5 = std::__cxx11::string::find((string *)uVar1,(ulong)&local_f8);
        local_161 = lVar5 == 0;
      }
      if ((toAdd.field_2._M_local_buf[0xf] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_f8);
      }
      local_d2 = local_161;
      std::__cxx11::string::string((string *)&relative,(string *)startOfFile.field_2._8_8_);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        cmSystemTools::RelativePath(&local_148,sourceDir,(string *)startOfFile.field_2._8_8_);
        local_128 = &local_148;
        uVar6 = std::__cxx11::string::size();
        uVar7 = std::__cxx11::string::size();
        if (uVar7 < uVar6) {
          std::__cxx11::string::operator=((string *)&relative,(string *)local_128);
        }
        std::__cxx11::string::~string((string *)&local_148);
      }
      if ((local_d1 & 1) == 0) {
        if ((local_d2 & 1) == 0) {
          if (explicitFiles !=
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(explicitFiles,(value_type *)&relative);
          }
        }
        else if (cmakeRootDir.field_2._8_8_ != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)cmakeRootDir.field_2._8_8_,(value_type *)&relative);
        }
      }
      else if (internalFiles !=
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(internalFiles,(value_type *)&relative);
      }
      std::__cxx11::string::~string((string *)&relative);
      std::__cxx11::string::~string((string *)local_d0);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)&makefiles);
  return;
}

Assistant:

void cmGetCMakeInputs(const cmGlobalGenerator* gg,
                      const std::string& sourceDir,
                      const std::string& buildDir,
                      std::vector<std::string>* internalFiles,
                      std::vector<std::string>* explicitFiles,
                      std::vector<std::string>* tmpFiles)
{
  const std::string cmakeRootDir = cmSystemTools::GetCMakeRoot() + '/';
  std::vector<cmMakefile*> const& makefiles = gg->GetMakefiles();
  for (cmMakefile const* mf : makefiles) {
    for (std::string const& lf : mf->GetListFiles()) {

      const std::string startOfFile = lf.substr(0, cmakeRootDir.size());
      const bool isInternal = (startOfFile == cmakeRootDir);
      const bool isTemporary = !isInternal && (lf.find(buildDir + '/') == 0);

      std::string toAdd = lf;
      if (!sourceDir.empty()) {
        const std::string& relative =
          cmSystemTools::RelativePath(sourceDir, lf);
        if (toAdd.size() > relative.size()) {
          toAdd = relative;
        }
      }

      if (isInternal) {
        if (internalFiles) {
          internalFiles->push_back(std::move(toAdd));
        }
      } else {
        if (isTemporary) {
          if (tmpFiles) {
            tmpFiles->push_back(std::move(toAdd));
          }
        } else {
          if (explicitFiles) {
            explicitFiles->push_back(std::move(toAdd));
          }
        }
      }
    }
  }
}